

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_aabb.h
# Opt level: O2

_aabb<float> * __thiscall xray_re::_aabb<float>::merge(_aabb<float> *this,_aabb<float> *box)

{
  float *pfVar1;
  float fVar2;
  
  fVar2 = (box->field_0).field_1.x1;
  if (fVar2 < (this->field_0).field_1.x1) {
    (this->field_0).field_1.x1 = fVar2;
  }
  fVar2 = (box->field_0).field_1.y1;
  if (fVar2 < (this->field_0).field_1.y1) {
    (this->field_0).field_1.y1 = fVar2;
  }
  fVar2 = (box->field_0).field_1.z1;
  if (fVar2 < (this->field_0).field_1.z1) {
    (this->field_0).field_1.z1 = fVar2;
  }
  fVar2 = (box->field_0).field_1.x2;
  pfVar1 = &(this->field_0).field_1.x2;
  if (*pfVar1 <= fVar2 && fVar2 != *pfVar1) {
    (this->field_0).field_1.x2 = fVar2;
  }
  fVar2 = (box->field_0).field_1.y2;
  pfVar1 = &(this->field_0).field_1.y2;
  if (*pfVar1 <= fVar2 && fVar2 != *pfVar1) {
    (this->field_0).field_1.y2 = fVar2;
  }
  fVar2 = (box->field_0).field_1.z2;
  pfVar1 = &(this->field_0).field_1.z2;
  if (*pfVar1 <= fVar2 && fVar2 != *pfVar1) {
    (this->field_0).field_1.z2 = fVar2;
  }
  return this;
}

Assistant:

inline _aabb<T>& _aabb<T>::merge(const _aabb<T>& box)
{
	if (x1 > box.x1)
		x1 = box.x1;
	if (y1 > box.y1)
		y1 = box.y1;
	if (z1 > box.z1)
		z1 = box.z1;
	if (x2 < box.x2)
		x2 = box.x2;
	if (y2 < box.y2)
		y2 = box.y2;
	if (z2 < box.z2)
		z2 = box.z2;
	return *this;
}